

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int iVar1;
  int p_col;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  pointer pnVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  pointer pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  undefined4 *puVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  iVar13 = this->thedim;
  if (0 < iVar13) {
    piVar4 = (this->row).perm;
    piVar5 = (this->temp).s_mark;
    iVar1 = (this->temp).stage;
    lVar20 = (long)iVar1;
    piVar6 = (this->u).row.len;
    lVar15 = 0;
    do {
      if ((piVar4[lVar15] < 0) && (piVar6[lVar15] == 1)) {
        iVar13 = (this->temp).stage;
        (this->temp).stage = iVar13 + 1;
        piVar5[iVar13] = (int)lVar15;
        iVar13 = this->thedim;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar13);
    if (iVar1 < (this->temp).stage) {
      do {
        iVar13 = piVar5[lVar20];
        iVar1 = (this->u).row.start[iVar13];
        pnVar7 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_col = (this->u).row.idx[iVar1];
        pnVar17 = pnVar7 + iVar1;
        pcVar16 = &local_1b8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar16->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_1b8.exp = pnVar7[iVar1].m_backend.exp;
        local_1b8.neg = pnVar7[iVar1].m_backend.neg;
        local_1b8.fpclass = pnVar7[iVar1].m_backend.fpclass;
        local_1b8.prec_elem = pnVar7[iVar1].m_backend.prec_elem;
        pcVar16 = &local_1b8;
        pnVar18 = &local_b0;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        local_b0.m_backend.exp = local_1b8.exp;
        local_b0.m_backend.neg = local_1b8.neg;
        local_b0.m_backend.fpclass = local_1b8.fpclass;
        local_b0.m_backend.prec_elem = local_1b8.prec_elem;
        setPivot(this,(int)lVar20,p_col,iVar13,&local_b0);
        (this->u).row.len[iVar13] = 0;
        iVar1 = (this->u).col.start[p_col];
        piVar4 = (this->u).col.idx;
        iVar2 = (this->temp).s_cact[p_col];
        iVar9 = makeLvec(this,iVar2 + -1,iVar13);
        piVar6 = (this->u).col.len;
        iVar3 = piVar6[p_col];
        iVar10 = iVar3 - iVar2;
        piVar6[p_col] = iVar10;
        if (0 < iVar2) {
          lVar15 = (long)iVar10;
          do {
            iVar2 = piVar4[iVar1 + lVar15];
            if (iVar2 != iVar13) {
              piVar6 = (this->u).row.len;
              iVar10 = piVar6[iVar2];
              piVar6[iVar2] = iVar10 + -1;
              lVar11 = (long)(iVar10 + -1 + (this->u).row.start[iVar2]);
              lVar12 = lVar11 * 0x80 + 0x80;
              lVar8 = lVar11 * 4;
              do {
                lVar21 = lVar8;
                lVar14 = lVar12;
                lVar12 = lVar14 + -0x80;
                lVar8 = lVar21 + -4;
              } while (*(int *)((long)(this->u).row.idx + lVar21) != p_col);
              (this->l).idx[iVar9] = iVar2;
              local_138.fpclass = cpp_dec_float_finite;
              local_138.prec_elem = 0x1c;
              local_138.data._M_elems[0] = 0;
              local_138.data._M_elems[1] = 0;
              local_138.data._M_elems[2] = 0;
              local_138.data._M_elems[3] = 0;
              local_138.data._M_elems[4] = 0;
              local_138.data._M_elems[5] = 0;
              local_138.data._M_elems[6] = 0;
              local_138.data._M_elems[7] = 0;
              local_138.data._M_elems[8] = 0;
              local_138.data._M_elems[9] = 0;
              local_138.data._M_elems[10] = 0;
              local_138.data._M_elems[0xb] = 0;
              local_138.data._M_elems[0xc] = 0;
              local_138.data._M_elems[0xd] = 0;
              local_138.data._M_elems[0xe] = 0;
              local_138.data._M_elems[0xf] = 0;
              local_138.data._M_elems[0x10] = 0;
              local_138.data._M_elems[0x11] = 0;
              local_138.data._M_elems[0x12] = 0;
              local_138.data._M_elems[0x13] = 0;
              local_138.data._M_elems[0x14] = 0;
              local_138.data._M_elems[0x15] = 0;
              local_138.data._M_elems[0x16] = 0;
              local_138.data._M_elems[0x17] = 0;
              local_138.data._M_elems[0x18] = 0;
              local_138.data._M_elems[0x19] = 0;
              local_138.data._M_elems._104_5_ = 0;
              local_138.data._M_elems[0x1b]._1_3_ = 0;
              local_138.exp = 0;
              local_138.neg = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&local_138,
                         (cpp_dec_float<200U,_int,_void> *)
                         ((long)(this->u).row.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar14),&local_1b8);
              pnVar7 = (this->l).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar16 = &local_138;
              pnVar17 = pnVar7 + iVar9;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar17->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4)
                ;
                pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              pnVar7[iVar9].m_backend.exp = local_138.exp;
              pnVar7[iVar9].m_backend.neg = local_138.neg;
              pnVar7[iVar9].m_backend.fpclass = local_138.fpclass;
              pnVar7[iVar9].m_backend.prec_elem = local_138.prec_elem;
              iVar9 = iVar9 + 1;
              piVar6 = (this->u).row.idx;
              *(int *)((long)piVar6 + lVar21) = piVar6[lVar11];
              pnVar7 = (this->u).row.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar17 = pnVar7 + lVar11;
              puVar19 = (undefined4 *)((long)pnVar7[-1].m_backend.data._M_elems + lVar14);
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                *puVar19 = (pnVar17->m_backend).data._M_elems[0];
                pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
                puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
              }
              *(int *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar14) =
                   pnVar7[lVar11].m_backend.exp;
              *(bool *)((long)(&pnVar7[-1].m_backend.data + 1) + 4U + lVar14) =
                   pnVar7[lVar11].m_backend.neg;
              *(undefined8 *)((long)(&pnVar7[-1].m_backend.data + 1) + 8U + lVar14) =
                   *(undefined8 *)&pnVar7[lVar11].m_backend.fpclass;
              if (iVar10 == 2) {
                iVar10 = (this->temp).stage;
                (this->temp).stage = iVar10 + 1;
                piVar5[iVar10] = iVar2;
              }
              else if (iVar10 == 1) {
                this->stat = SINGULAR;
                return;
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < iVar3);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < (this->temp).stage);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}